

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

realtype N_VMin_SensWrapper(N_Vector x)

{
  long lVar1;
  realtype rVar2;
  realtype rVar3;
  
  rVar2 = N_VMin((N_Vector)**x->content);
  for (lVar1 = 1; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    rVar3 = N_VMin(*(N_Vector *)(*x->content + lVar1 * 8));
    if (rVar2 <= rVar3) {
      rVar3 = rVar2;
    }
    rVar2 = rVar3;
  }
  return rVar2;
}

Assistant:

realtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  realtype min, tmp;

  min = N_VMin(NV_VEC_SW(x,0));

  for (i=1; i < NV_NVECS_SW(x); i++) {
    tmp = N_VMin(NV_VEC_SW(x,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}